

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O0

void Dumper::dumpBBlockEdges(RWBBlock *block)

{
  RWNode *pRVar1;
  bool bVar2;
  reference ppRVar3;
  BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode> *in_RDI;
  RWNode *node;
  iterator __end1;
  iterator __begin1;
  NodesT *__range1;
  RWNode *last;
  list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20;
  NodesT *local_18;
  RWNode *local_10;
  
  local_10 = (RWNode *)0x0;
  local_18 = dg::BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode>::getNodes_abi_cxx11_(in_RDI);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
                 (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar2 = std::operator!=(&local_20,&local_28);
    if (!bVar2) break;
    ppRVar3 = std::_List_iterator<dg::dda::RWNode_*>::operator*
                        ((_List_iterator<dg::dda::RWNode_*> *)0x17b59e);
    pRVar1 = *ppRVar3;
    if (local_10 != (RWNode *)0x0) {
      printf("\tNODE%p->NODE%p [constraint=true]\n",local_10,pRVar1);
    }
    local_10 = pRVar1;
    std::_List_iterator<dg::dda::RWNode_*>::operator++(&local_20);
  }
  putchar(10);
  return;
}

Assistant:

static void dumpBBlockEdges(RWBBlock *block) {
        // dump CFG edges between nodes in one block
        RWNode *last = nullptr;
        for (RWNode *node : block->getNodes()) {
            if (last) { // successor edge
                printf("\tNODE%p->NODE%p [constraint=true]\n",
                       static_cast<void *>(last), static_cast<void *>(node));
            }
            last = node;
        }
        putchar('\n');
    }